

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O0

void __thiscall
adjMaxtrix<char>::CreatGraph(adjMaxtrix<char> *this,char *V,int n,RowColWeight *E,int e)

{
  int local_34;
  int local_30;
  int k;
  int i;
  int e_local;
  RowColWeight *E_local;
  int n_local;
  char *V_local;
  adjMaxtrix<char> *this_local;
  
  for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
    InsertVertex(this,V[local_30]);
  }
  for (local_34 = 0; local_34 < e; local_34 = local_34 + 1) {
    InsertEdge(this,E[local_34].row,E[local_34].col,E[local_34].weight);
  }
  return;
}

Assistant:

void adjMaxtrix<dataType>::CreatGraph(dataType V[], int n, RowColWeight E[], int e)
{
	int i, k;
	//Initiate(n);	//顶点顺序表初始化
	for (i = 0; i < n; i++)
		InsertVertex(V[i]);	//插入顶点
	for (k = 0; k < e; k++)
		InsertEdge(E[k].row, E[k].col, E[k].weight);//插入边
}